

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetInvoice(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  type_conflict4 tVar2;
  self_type *psVar3;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ptr PVar5;
  path_type local_90;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  locale local_40 [8];
  TgTypeParser *local_38;
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::Invoice,std::allocator<TgBot::Invoice>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(Invoice **)this,
             (allocator<TgBot::Invoice> *)&local_90);
  paVar1 = &local_90.m_value.field_2;
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  local_38 = this + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"title","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar3 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_60,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar3);
  std::__cxx11::string::operator=(*(string **)this,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"description","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar3 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_60,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar3);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x20),(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"start_parameter","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar3 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_60,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar3);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x40),(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"currency","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar3 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_60,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar3);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x60),(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"total_amount","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar3 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  std::locale::locale(local_40);
  std::locale::locale((locale *)local_60,local_40);
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar3,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     local_60);
  std::locale::~locale((locale *)local_60);
  std::locale::~locale(local_40);
  *(type_conflict4 *)(*(long *)this + 0x80) = tVar2;
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
    _Var4._M_pi = extraout_RDX_00;
  }
  PVar5.super___shared_ptr<TgBot::Invoice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  PVar5.super___shared_ptr<TgBot::Invoice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar5.super___shared_ptr<TgBot::Invoice,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Invoice::Ptr TgTypeParser::parseJsonAndGetInvoice(const boost::property_tree::ptree& data) const {
    auto result(make_shared<Invoice>());
    result->title = data.get<string>("title");
    result->description = data.get<string>("description");
    result->startParameter = data.get<string>("start_parameter");
    result->currency = data.get<string>("currency");
    result->totalAmount = data.get<int32_t>("total_amount");
    return result;
}